

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

Snapshot * __thiscall
cmState::CreateBuildsystemDirectorySnapshot
          (Snapshot *__return_storage_ptr__,cmState *this,Snapshot originSnapshot,
          string *entryPointCommand,long entryPointLine)

{
  PositionType *this_00;
  cmLinkedTree<cmDefinitions> *pcVar1;
  PositionType PVar2;
  PositionType PVar3;
  iterator it;
  bool bVar4;
  PointerType pSVar5;
  PointerType pBVar6;
  PointerType pSVar7;
  iterator iVar8;
  iterator iVar9;
  iterator iVar10;
  iterator local_40;
  
  bVar4 = Snapshot::IsValid(&originSnapshot);
  if (!bVar4) {
    __assert_fail("originSnapshot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                  ,0x354,
                  "cmState::Snapshot cmState::CreateBuildsystemDirectorySnapshot(Snapshot, const std::string &, long)"
                 );
  }
  this_00 = &originSnapshot.Position;
  it.Position = originSnapshot.Position.Position;
  it.Tree = originSnapshot.Position.Tree;
  local_40 = cmLinkedTree<cmState::SnapshotDataType>::Push(&this->SnapshotData,it);
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  pSVar5->EntryPointLine = entryPointLine;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  std::__cxx11::string::_M_assign((string *)&pSVar5->EntryPointCommand);
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  (pSVar5->DirectoryParent).Tree = originSnapshot.Position.Tree;
  (pSVar5->DirectoryParent).Position = originSnapshot.Position.Position;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  (pSVar5->ScopeParent).Tree = originSnapshot.Position.Tree;
  (pSVar5->ScopeParent).Position = originSnapshot.Position.Position;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  pSVar5->SnapshotType = BuildsystemDirectoryType;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  pSVar5->Keep = true;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  iVar8 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Push
                    (&this->BuildsystemDirectory,pSVar5->BuildSystemDirectory);
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  pSVar5->BuildSystemDirectory = iVar8;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  iVar9 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Push(&this->ExecutionListFiles,pSVar5->ExecutionListFile);
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  pSVar5->ExecutionListFile = iVar9;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  pBVar6 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar5->BuildSystemDirectory);
  (pBVar6->DirectoryEnd).Tree = local_40.Tree;
  (pBVar6->DirectoryEnd).Position = local_40.Position;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pSVar7 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  PVar3 = (pSVar5->Policies).Position;
  (pSVar7->Policies).Tree = (pSVar5->Policies).Tree;
  (pSVar7->Policies).Position = PVar3;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pSVar7 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  PVar3 = (pSVar5->Policies).Position;
  (pSVar7->PolicyRoot).Tree = (pSVar5->Policies).Tree;
  (pSVar7->PolicyRoot).Position = PVar3;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pSVar7 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  PVar3 = (pSVar5->Policies).Position;
  (pSVar7->PolicyScope).Tree = (pSVar5->Policies).Tree;
  (pSVar7->PolicyScope).Position = PVar3;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  bVar4 = cmLinkedTree<cmState::PolicyStackEntry>::iterator::IsValid(&pSVar5->Policies);
  if (bVar4) {
    pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
    bVar4 = cmLinkedTree<cmState::PolicyStackEntry>::iterator::IsValid(&pSVar5->PolicyRoot);
    if (bVar4) {
      pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
      pcVar1 = (pSVar5->Vars).Tree;
      PVar2 = (pSVar5->Vars).Position;
      iVar10 = pSVar5->Vars;
      pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
      (pSVar5->Parent).Tree = pcVar1;
      (pSVar5->Parent).Position = PVar2;
      pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
      (pSVar5->Root).Tree = pcVar1;
      (pSVar5->Root).Position = PVar2;
      iVar10 = cmLinkedTree<cmDefinitions>::Push(&this->VarTree,iVar10);
      pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
      pSVar5->Vars = iVar10;
      __return_storage_ptr__->State = this;
      (__return_storage_ptr__->Position).Tree = local_40.Tree;
      (__return_storage_ptr__->Position).Position = local_40.Position;
      pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
      pBVar6 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                         (&pSVar5->BuildSystemDirectory);
      std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::push_back
                (&pBVar6->Children,__return_storage_ptr__);
      Snapshot::SetDefaultDefinitions(__return_storage_ptr__);
      Snapshot::InitializeFromParent(__return_storage_ptr__);
      Snapshot::SetDirectoryDefinitions(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    __assert_fail("pos->PolicyRoot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                  ,0x367,
                  "cmState::Snapshot cmState::CreateBuildsystemDirectorySnapshot(Snapshot, const std::string &, long)"
                 );
  }
  __assert_fail("pos->Policies.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                ,0x366,
                "cmState::Snapshot cmState::CreateBuildsystemDirectorySnapshot(Snapshot, const std::string &, long)"
               );
}

Assistant:

cmState::Snapshot
cmState::CreateBuildsystemDirectorySnapshot(Snapshot originSnapshot,
                                    std::string const& entryPointCommand,
                                    long entryPointLine)
{
  assert(originSnapshot.IsValid());
  PositionType pos = this->SnapshotData.Push(originSnapshot.Position);
  pos->EntryPointLine = entryPointLine;
  pos->EntryPointCommand = entryPointCommand;
  pos->DirectoryParent = originSnapshot.Position;
  pos->ScopeParent = originSnapshot.Position;
  pos->SnapshotType = BuildsystemDirectoryType;
  pos->Keep = true;
  pos->BuildSystemDirectory =
      this->BuildsystemDirectory.Push(
        originSnapshot.Position->BuildSystemDirectory);
  pos->ExecutionListFile =
      this->ExecutionListFiles.Push(
        originSnapshot.Position->ExecutionListFile);
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->Policies = originSnapshot.Position->Policies;
  pos->PolicyRoot = originSnapshot.Position->Policies;
  pos->PolicyScope = originSnapshot.Position->Policies;
  assert(pos->Policies.IsValid());
  assert(pos->PolicyRoot.IsValid());

  cmLinkedTree<cmDefinitions>::iterator origin =
      originSnapshot.Position->Vars;
  pos->Parent = origin;
  pos->Root = origin;
  pos->Vars = this->VarTree.Push(origin);

  cmState::Snapshot snapshot = cmState::Snapshot(this, pos);
  originSnapshot.Position->BuildSystemDirectory->Children.push_back(snapshot);
  snapshot.SetDefaultDefinitions();
  snapshot.InitializeFromParent();
  snapshot.SetDirectoryDefinitions();
  return snapshot;
}